

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O1

uintptr_t nettlp_msg_get_bar4_start(in_addr addr)

{
  int __fd;
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  uintptr_t bar4_addr;
  int req;
  pollfd x [1];
  uintptr_t local_20;
  undefined4 local_14;
  pollfd local_10;
  
  local_20 = 0;
  __fd = nettlp_msg_socket(addr);
  if (0 < __fd) {
    local_14 = 1;
    write(__fd,&local_14,4);
    local_10.events = 1;
    local_10.fd = __fd;
    iVar1 = poll(&local_10,1,500);
    if (iVar1 == 0) {
      piVar3 = __errno_location();
      *piVar3 = 0x3e;
    }
    else {
      sVar2 = read(__fd,&local_20,8);
      if (-1 < (int)sVar2) {
        close(__fd);
        return local_20;
      }
    }
    close(__fd);
  }
  return 0;
}

Assistant:

uintptr_t nettlp_msg_get_bar4_start(struct in_addr addr)
{
	int sock, req, ret = 0;
	uintptr_t bar4_addr = 0;
	struct pollfd x[1];

	sock = nettlp_msg_socket(addr);
	if (sock < 1)
		return 0;

	/* send GET_BAR4 request */
	req = NETTLP_MSG_GET_BAR4_ADDR;
	ret = write(sock, &req, sizeof(req));

	/* recv response with timeout */
	x[0].fd = sock;
	x[0].events = POLLIN;

	ret = poll(x, 1, LIBTLP_CPL_TIMEOUT);
	if (ret == 0) {
		errno = ETIME;
		goto err_out;
	}

	ret = read(sock, &bar4_addr, sizeof(bar4_addr));
	if (ret < 0)
		goto err_out;

	close(sock);
	return bar4_addr;

err_out:
	close(sock);
	return 0;
}